

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O2

bool __thiscall SimpleConfigLoader::loadConfiguration(SimpleConfigLoader *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_t sVar4;
  char *pcVar5;
  Configuration *pCVar6;
  long lVar7;
  SimpleConfigLoader *pSVar8;
  string *psVar9;
  long lVar10;
  bool boolValue;
  allocator local_561;
  string stringValue;
  string stringName;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  char fileBuf [1024];
  
  pcVar3 = getConfigPath(this);
  __stream = fopen(pcVar3,"r");
  if (__stream == (FILE *)0x0) {
    softHSMLog(3,"loadConfiguration",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
               ,0x54,"Could not open the config file: %s",pcVar3);
    free(pcVar3);
  }
  else {
    free(pcVar3);
    lVar10 = 1;
    while (pcVar3 = fgets(fileBuf,0x400,__stream), pcVar3 != (char *)0x0) {
      sVar4 = strcspn(fileBuf,"#\n\r");
      fileBuf[sVar4] = '\0';
      if (fileBuf[0] == '\0') goto LAB_00117d79;
      pSVar8 = (SimpleConfigLoader *)fileBuf;
      pcVar3 = strtok(fileBuf,"=");
      if (pcVar3 == (char *)0x0) {
        iVar2 = 0x73;
LAB_00117bb7:
        softHSMLog(4,"loadConfiguration",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                   ,iVar2,"Bad format on line %lu, skip",lVar10);
        goto LAB_00117d79;
      }
      pcVar3 = trimString(pSVar8,pcVar3);
      if (pcVar3 == (char *)0x0) {
        iVar2 = 0x7b;
        goto LAB_00117bb7;
      }
      pSVar8 = (SimpleConfigLoader *)0x0;
      pcVar5 = strtok((char *)0x0,"=");
      if (pcVar5 == (char *)0x0) {
        iVar2 = 0x82;
LAB_00117bfc:
        softHSMLog(4,"loadConfiguration",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                   ,iVar2,"Bad format on line %lu, skip",lVar10);
        free(pcVar3);
        goto LAB_00117d79;
      }
      pcVar5 = trimString(pSVar8,pcVar5);
      if (pcVar5 == (char *)0x0) {
        iVar2 = 0x8b;
        goto LAB_00117bfc;
      }
      std::__cxx11::string::string((string *)&stringName,pcVar3,(allocator *)&stringValue);
      std::__cxx11::string::string((string *)&stringValue,pcVar5,&local_561);
      free(pcVar3);
      free(pcVar5);
      pCVar6 = Configuration::i();
      std::__cxx11::string::string((string *)&local_458,(string *)&stringName);
      iVar2 = Configuration::getType(pCVar6,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      switch(iVar2) {
      case 1:
        pCVar6 = Configuration::i();
        std::__cxx11::string::string((string *)&local_4b8,(string *)&stringName);
        std::__cxx11::string::string((string *)&local_478,(string *)&stringValue);
        psVar9 = &local_4b8;
        Configuration::setString(pCVar6,psVar9,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        break;
      case 2:
        pCVar6 = Configuration::i();
        std::__cxx11::string::string((string *)&local_4d8,(string *)&stringName);
        iVar2 = atoi(stringValue._M_dataplus._M_p);
        psVar9 = &local_4d8;
        Configuration::setInt(pCVar6,psVar9,iVar2);
        break;
      case 3:
        pCVar6 = Configuration::i();
        std::__cxx11::string::string((string *)&local_4f8,(string *)&stringName);
        lVar7 = strtol(stringValue._M_dataplus._M_p,(char **)0x0,8);
        psVar9 = &local_4f8;
        Configuration::setInt(pCVar6,psVar9,(int)lVar7);
        break;
      case 4:
        psVar9 = &local_498;
        std::__cxx11::string::string((string *)psVar9,(string *)&stringValue);
        bVar1 = string2bool((SimpleConfigLoader *)psVar9,&local_498,&boolValue);
        std::__cxx11::string::~string((string *)&local_498);
        if (bVar1) {
          pCVar6 = Configuration::i();
          std::__cxx11::string::string((string *)&local_518,(string *)&stringName);
          psVar9 = &local_518;
          Configuration::setBool(pCVar6,psVar9,boolValue);
          break;
        }
        softHSMLog(4,"loadConfiguration",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                   ,0xa9,"The value %s is not a boolean",stringValue._M_dataplus._M_p);
        goto LAB_00117d65;
      default:
        softHSMLog(4,"loadConfiguration",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                   ,0xaf,"The following configuration is not supported: %s = %s",
                   stringName._M_dataplus._M_p,stringValue._M_dataplus._M_p);
        goto LAB_00117d65;
      }
      std::__cxx11::string::~string((string *)psVar9);
LAB_00117d65:
      std::__cxx11::string::~string((string *)&stringValue);
      std::__cxx11::string::~string((string *)&stringName);
LAB_00117d79:
      lVar10 = lVar10 + 1;
    }
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool SimpleConfigLoader::loadConfiguration()
{
	char* configPath = getConfigPath();

	FILE* fp = fopen(configPath,"r");

	if (fp == NULL)
	{
		ERROR_MSG("Could not open the config file: %s", configPath);
		free(configPath);
		return false;
	}
	free(configPath);

	char fileBuf[1024];

	// Format in config file
	//
	// <name> = <value>
	// # Line is ignored

	size_t line = 0;
	while (fgets(fileBuf, sizeof(fileBuf), fp) != NULL)
	{
		line++;

		// End the string at the first comment or newline
		fileBuf[strcspn(fileBuf, "#\n\r")] = '\0';

		// Skip empty lines
		if (fileBuf[0] == '\0')
		{
			continue;
		}

		// Get the first part of the line
		char* name = strtok(fileBuf, "=");
		if (name == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Trim the name
		char* trimmedName = trimString(name);
		if (trimmedName == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Get the second part of the line
		char* value = strtok(NULL, "=");
		if(value == NULL) {
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Trim the value
		char* trimmedValue = trimString(value);
		if (trimmedValue == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Save name,value
		std::string stringName(trimmedName);
		std::string stringValue(trimmedValue);
		free(trimmedName);
		free(trimmedValue);

		switch (Configuration::i()->getType(stringName))
		{
			case CONFIG_TYPE_STRING:
				Configuration::i()->setString(stringName, stringValue);
				break;
			case CONFIG_TYPE_INT:
				Configuration::i()->setInt(stringName, atoi(stringValue.c_str()));
				break;
			case CONFIG_TYPE_INT_OCTAL:
				Configuration::i()->setInt(stringName, strtol(stringValue.c_str(), NULL, 8));
				break;
			case CONFIG_TYPE_BOOL:
				bool boolValue;
				if (string2bool(stringValue, &boolValue))
				{
					Configuration::i()->setBool(stringName, boolValue);
				}
				else
				{
					WARNING_MSG("The value %s is not a boolean", stringValue.c_str());
				}
				break;
			case CONFIG_TYPE_UNSUPPORTED:
			default:
				WARNING_MSG("The following configuration is not supported: %s = %s",
					stringName.c_str(), stringValue.c_str());
				break;
		}
	}

	fclose(fp);

	return true;
}